

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O0

void __thiscall QTimer::start(QTimer *this)

{
  bool bVar1;
  TimerId TVar2;
  QTimerPrivate *this_00;
  QTimer *in_RDI;
  long in_FS_OFFSET;
  TimerId newId;
  QTimerPrivate *d;
  nanoseconds in_stack_00000088;
  QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
  *__d;
  TimerType in_stack_fffffffffffffff4;
  QObject *this_01;
  
  this_01 = *(QObject **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTimer *)0x42af7a);
  bVar1 = QTimerPrivate::isActive(this_00);
  if (bVar1) {
    stop(in_RDI);
  }
  __d = &this_00->inter;
  ms<(char)49>();
  std::chrono::
  operator*<QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>,_long,_std::ratio<1L,_1000L>_>
            (__d,(duration<long,_std::ratio<1L,_1000L>_> *)0x42afbe);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI,
             (duration<long,_std::ratio<1L,_1000L>_> *)__d);
  QObjectBindableProperty::operator_cast_to_TimerType
            ((QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
              *)0x42afe3);
  TVar2 = QObject::startTimer(this_01,in_stack_00000088,in_stack_fffffffffffffff4);
  if (0 < (int)TVar2) {
    this_00->id = TVar2;
    QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
    ::notify((QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
              *)this_00);
  }
  if (*(QObject **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTimer::start()
{
    Q_D(QTimer);
    if (d->isActive()) // stop running timer
        stop();

    Qt::TimerId newId{ QObject::startTimer(d->inter * 1ms, d->type) }; // overflow impossible
    if (newId > Qt::TimerId::Invalid) {
        d->id = newId;
        d->isActiveData.notify();
    }
}